

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_String.cc
# Opt level: O2

void __thiscall Pl_String::Pl_String(Pl_String *this,char *identifier,Pipeline *next,string *s)

{
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_String_002af7f8;
  std::make_unique<Pl_String::Members,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->m);
  return;
}

Assistant:

Pl_String::Pl_String(char const* identifier, Pipeline* next, std::string& s) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(s))
{
}